

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_uint.h
# Opt level: O2

void vec_uint_print(vec_uint_t *p)

{
  ulong uVar1;
  
  if (p != (vec_uint_t *)0x0) {
    fprintf(_stdout,"Vector has %u(%u) entries: {",(ulong)p->size,(ulong)p->cap);
    for (uVar1 = 0; uVar1 < p->size; uVar1 = uVar1 + 1) {
      fprintf(_stdout," %u",(ulong)p->data[uVar1]);
    }
    fwrite(" }\n",3,1,_stdout);
    return;
  }
  __assert_fail("p != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                ,0x104,"void vec_uint_print(vec_uint_t *)");
}

Assistant:

static inline void vec_uint_print(vec_uint_t* p)
{
    unsigned i;
    assert(p != NULL);
    fprintf(stdout, "Vector has %u(%u) entries: {", p->size, p->cap);
    for (i = 0; i < p->size; i++)
        fprintf(stdout, " %u", p->data[i]);
    fprintf(stdout, " }\n");
}